

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O3

void addMiniBatchSize<CoreML::Specification::NeuralNetwork>
               (NeuralNetwork *nn,OptimizerTypeCase optimizerType,int64_t defaultValue,
               int64_t minValue,int64_t maxValue,
               set<long,_std::less<long>,_std::allocator<long>_> *allowedValues)

{
  RepeatedField<long> *this;
  ulong uVar1;
  long lVar2;
  NetworkUpdateParameters *pNVar3;
  Optimizer *this_00;
  AdamOptimizer *pAVar4;
  Int64Parameter *this_01;
  long *plVar5;
  _Base_ptr p_Var6;
  Int64Range *pIVar7;
  _Rb_tree_header *p_Var8;
  uint uVar9;
  Arena *pAVar10;
  long tmp;
  Int64Set *local_38;
  
  pNVar3 = nn->updateparams_;
  if (pNVar3 == (NetworkUpdateParameters *)0x0) {
    uVar1 = (nn->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    pNVar3 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::NetworkUpdateParameters>(pAVar10);
    nn->updateparams_ = pNVar3;
  }
  this_00 = pNVar3->optimizer_;
  if (this_00 == (Optimizer *)0x0) {
    uVar1 = (pNVar3->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Optimizer>(pAVar10)
    ;
    pNVar3->optimizer_ = this_00;
  }
  if (optimizerType == kAdamOptimizer) {
    if (this_00->_oneof_case_[0] != 0xb) {
      CoreML::Specification::Optimizer::clear_OptimizerType(this_00);
      this_00->_oneof_case_[0] = 0xb;
      uVar1 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
      pAVar10 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar10 = *(Arena **)pAVar10;
      }
      pAVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::AdamOptimizer>
                         (pAVar10);
      goto LAB_0019dcd9;
    }
LAB_0019dca6:
    pAVar4 = (AdamOptimizer *)(this_00->OptimizerType_).sgdoptimizer_;
  }
  else {
    if (optimizerType != kSgdOptimizer) {
      this_01 = (Int64Parameter *)0x0;
      goto LAB_0019dd0c;
    }
    if (this_00->_oneof_case_[0] == 10) goto LAB_0019dca6;
    CoreML::Specification::Optimizer::clear_OptimizerType(this_00);
    this_00->_oneof_case_[0] = 10;
    uVar1 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    pAVar4 = (AdamOptimizer *)
             google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SGDOptimizer>
                       (pAVar10);
LAB_0019dcd9:
    (this_00->OptimizerType_).sgdoptimizer_ = (SGDOptimizer *)pAVar4;
  }
  this_01 = pAVar4->minibatchsize_;
  if (this_01 == (Int64Parameter *)0x0) {
    uVar1 = (pAVar4->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Parameter>
                        (pAVar10);
    pAVar4->minibatchsize_ = this_01;
  }
LAB_0019dd0c:
  this_01->defaultvalue_ = defaultValue;
  if ((allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (this_01->_oneof_case_[0] == 10) {
      pIVar7 = (this_01->AllowedValues_).range_;
    }
    else {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(this_01);
      this_01->_oneof_case_[0] = 10;
      uVar1 = (this_01->super_MessageLite)._internal_metadata_.ptr_;
      pAVar10 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar10 = *(Arena **)pAVar10;
      }
      pIVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Range>
                         (pAVar10);
      (this_01->AllowedValues_).range_ = pIVar7;
    }
    pIVar7->minvalue_ = minValue;
    pIVar7->maxvalue_ = maxValue;
  }
  else {
    if (this_01->_oneof_case_[0] == 0xb) {
      local_38 = (this_01->AllowedValues_).set_;
    }
    else {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(this_01);
      this_01->_oneof_case_[0] = 0xb;
      uVar1 = (this_01->super_MessageLite)._internal_metadata_.ptr_;
      pAVar10 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar10 = *(Arena **)pAVar10;
      }
      local_38 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Set>
                           (pAVar10);
      (this_01->AllowedValues_).set_ = local_38;
    }
    p_Var6 = (allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var8 = &(allowedValues->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var8) {
      this = &local_38->values_;
      uVar9 = (local_38->values_).current_size_;
      do {
        lVar2 = *(long *)(p_Var6 + 1);
        if (uVar9 == (local_38->values_).total_size_) {
          google::protobuf::RepeatedField<long>::Reserve(this,uVar9 + 1);
          plVar5 = google::protobuf::RepeatedField<long>::elements(this);
          plVar5[uVar9] = lVar2;
        }
        else {
          plVar5 = google::protobuf::RepeatedField<long>::elements(this);
          plVar5[uVar9] = lVar2;
        }
        uVar9 = uVar9 + 1;
        this->current_size_ = uVar9;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var8);
    }
  }
  return;
}

Assistant:

void addMiniBatchSize(NeuralNetworkClass *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, int64_t defaultValue, int64_t minValue,  int64_t maxValue, std::set<int64_t> allowedValues) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();
    
    Specification::Int64Parameter *miniBatchSize = NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kSgdOptimizer:
            miniBatchSize = optimizer->mutable_sgdoptimizer()->mutable_minibatchsize();
            break;
        case Specification::Optimizer::kAdamOptimizer:
            miniBatchSize = optimizer->mutable_adamoptimizer()->mutable_minibatchsize();
            break;
        default:
            break;
    }
    
    miniBatchSize->set_defaultvalue(defaultValue);
    
    if (allowedValues.size() == 0) {
        auto int64Range = miniBatchSize->mutable_range();
        int64Range->set_minvalue(minValue);
        int64Range->set_maxvalue(maxValue);
    }
    else {
        auto int64Set = miniBatchSize->mutable_set();
        for (auto& x : allowedValues) {
            int64Set->add_values(x);
        }
    }
}